

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O0

void __thiscall
ast::Dir_byte::Dir_byte
          (Dir_byte *this,uint s,list<ast::Expression_*,_std::allocator<ast::Expression_*>_> *vl,
          Location left)

{
  uint uVar1;
  size_type sVar2;
  list<ast::Expression_*,_std::allocator<ast::Expression_*>_> *vl_local;
  uint s_local;
  Dir_byte *this_local;
  
  Directive::Directive(&this->super_Directive,left);
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_byte_0017e890;
  this->value_list = vl;
  this->grain_size = s;
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_offset =
       *(uint *)(Sections::current_section + 0x30);
  uVar1 = this->grain_size;
  sVar2 = std::__cxx11::list<ast::Expression_*,_std::allocator<ast::Expression_*>_>::size
                    (this->value_list);
  (this->super_Directive).super_Statement.size_in_memory = uVar1 * (int)sVar2;
  Sections::increase((this->super_Directive).super_Statement.section_index,
                     (this->super_Directive).super_Statement.size_in_memory);
  return;
}

Assistant:

Dir_byte::Dir_byte(unsigned s, list<Expression*> *vl, Location left) :
	Directive {left}, value_list {vl}, grain_size {s}
{
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	size_in_memory = grain_size * value_list->size();
	Sections::increase(section_index, size_in_memory);
}